

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O2

void __thiscall xLearn::Reader::Reader(Reader *this)

{
  this->_vptr_Reader = (_func_int **)&PTR__Reader_00182618;
  (this->filename_)._M_dataplus._M_p = (pointer)&(this->filename_).field_2;
  (this->filename_)._M_string_length = 0;
  (this->filename_).field_2._M_local_buf[0] = '\0';
  DMatrix::DMatrix(&this->data_samples_);
  this->shuffle_ = false;
  this->bin_out_ = true;
  (this->splitor_)._M_dataplus._M_p = (pointer)&(this->splitor_).field_2;
  (this->splitor_)._M_string_length = 0;
  (this->splitor_).field_2._M_local_buf[0] = '\0';
  this->block_size_ = 500;
  this->seed_ = 1;
  return;
}

Assistant:

Reader() : 
    shuffle_(false), 
    bin_out_(true),
    block_size_(kDefautBlockSize) {  }